

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_subquery.cpp
# Opt level: O1

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::Binder::PlanLateralJoin
          (Binder *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *left,unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *right,vector<duckdb::CorrelatedColumnInfo,_true> *correlated,JoinType join_type,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> condition)

{
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var1;
  unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
  uVar2;
  templated_unique_single_t tVar3;
  undefined4 uVar4;
  pointer pCVar5;
  bool perform_delim;
  int iVar6;
  pointer pEVar7;
  type op;
  pointer pLVar8;
  reference this_00;
  pointer pLVar9;
  type delim_join_00;
  unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>_> this_01;
  pointer pLVar10;
  type expr;
  BinderException *pBVar11;
  undefined7 in_register_00000081;
  vector<duckdb::CorrelatedColumnInfo,_true> *correlated_columns;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *in_stack_00000008;
  unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
  delim_join;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
  dependent_join;
  templated_unique_single_t filter;
  _Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false> local_1f8;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_1f0;
  pointer local_1e8;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_1e0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_1d8;
  undefined4 local_1cc;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  local_1c8;
  undefined1 local_1a8 [32];
  vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_> local_188;
  vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> local_168;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_148;
  vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> local_140;
  FlattenDependentJoins flatten;
  
  correlated_columns =
       (vector<duckdb::CorrelatedColumnInfo,_true> *)CONCAT71(in_register_00000081,join_type);
  local_188.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1cc = condition.
              super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
              super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
              _M_t.
              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl._0_4_;
  local_148._M_head_impl = (LogicalOperator *)this;
  if ((in_stack_00000008->
      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0) {
    pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(in_stack_00000008);
    iVar6 = (*(pEVar7->super_BaseExpression)._vptr_BaseExpression[4])(pEVar7);
    if ((char)iVar6 != '\0') {
      pBVar11 = (BinderException *)__cxa_allocate_exception(0x10);
      expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(in_stack_00000008);
      flatten.binder = (Binder *)&flatten.base_binding.column_index;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&flatten,"Subqueries are not supported in LATERAL join conditions","");
      BinderException::BinderException<>(pBVar11,expr,(string *)&flatten);
      __cxa_throw(pBVar11,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    _Var1._M_head_impl =
         left[2].
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    local_1d8._M_head_impl =
         (in_stack_00000008->
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (in_stack_00000008->
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    LogicalComparisonJoin::ExtractJoinConditions
              ((ClientContext *)_Var1._M_head_impl,
               (JoinType)
               condition.
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl,REGULAR,right,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)correlated,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_1d8,(vector<duckdb::JoinCondition,_true> *)&local_188,&local_1c8);
    if (local_1d8._M_head_impl != (Expression *)0x0) {
      (*((local_1d8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_1d8._M_head_impl = (Expression *)0x0;
  }
  perform_delim = PerformDuplicateElimination((Binder *)left,correlated_columns);
  local_1e0._M_head_impl =
       (right->
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  (right->super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
  _M_t.super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
  CreateDuplicateEliminatedJoin
            ((duckdb *)&delim_join,correlated_columns,
             (JoinType)
             condition.
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl,
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)&local_1e0,perform_delim);
  if (local_1e0._M_head_impl != (LogicalOperator *)0x0) {
    (*(local_1e0._M_head_impl)->_vptr_LogicalOperator[1])();
  }
  local_1e0._M_head_impl = (LogicalOperator *)0x0;
  FlattenDependentJoins::FlattenDependentJoins
            (&flatten,(Binder *)left,correlated_columns,perform_delim,false);
  op = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
       operator*((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)correlated);
  uVar4 = local_1cc;
  FlattenDependentJoins::DetectCorrelatedExpressions(&flatten,op,true,0);
  local_1e8 = (correlated->
              super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
              ).
              super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
  (correlated->
  super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>).
  super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  FlattenDependentJoins::PushDownDependentJoin
            ((FlattenDependentJoins *)&dependent_join,
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)&flatten,SUB81(&local_1e8,0));
  _Var1._M_head_impl = local_148._M_head_impl;
  if (local_1e8 != (pointer)0x0) {
    (**(code **)((local_1e8->binding).table_index + 8))();
  }
  local_1e8 = (pointer)0x0;
  pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(&dependent_join);
  (*pLVar8->_vptr_LogicalOperator[2])(&local_168,pLVar8);
  pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(&dependent_join);
  if (pLVar8->type == LOGICAL_MATERIALIZED_CTE) {
    pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(&dependent_join);
    this_00 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
              ::operator[](&pLVar8->children,1);
    pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(this_00);
    (*pLVar8->_vptr_LogicalOperator[2])(local_1a8,pLVar8);
    pCVar5 = local_168.
             super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_168.super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_1a8._0_8_;
    local_168.super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_1a8._8_8_;
    local_168.super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_1a8._16_8_;
    local_1a8._0_8_ = (pointer)0x0;
    local_1a8._8_8_ = (pointer)0x0;
    local_1a8._16_8_ = (_Hash_node_base *)0x0;
    if ((pointer)pCVar5 != (pointer)0x0) {
      operator_delete(pCVar5);
    }
    if ((pointer)local_1a8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1a8._0_8_);
    }
  }
  pLVar9 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
           ::operator->(&delim_join);
  local_1a8._0_8_ =
       (pLVar9->conditions).
       super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
       super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       (pLVar9->conditions).
       super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
       super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1a8._16_8_ =
       (pLVar9->conditions).
       super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
       super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (pLVar9->conditions).super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
  super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_188.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (pLVar9->conditions).super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
  super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_188.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (pLVar9->conditions).super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
  super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_188.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_188.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::~vector
            ((vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_> *)local_1a8);
  delim_join_00 =
       unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
       ::operator*(&delim_join);
  ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::vector
            (&local_140,&local_168);
  CreateDelimJoinConditions
            (delim_join_00,correlated_columns,(vector<duckdb::ColumnBinding,_true> *)&local_140,
             flatten.delim_offset,perform_delim);
  if (local_140.super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140.
                    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  pLVar9 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
           ::operator->(&delim_join);
  local_1f0._M_head_impl =
       (LogicalOperator *)
       dependent_join.
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  dependent_join.
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
       (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
        )0x0;
  LogicalOperator::AddChild
            ((LogicalOperator *)pLVar9,
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)&local_1f0);
  if ((_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)local_1f0._M_head_impl !=
      (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0) {
    (*(local_1f0._M_head_impl)->_vptr_LogicalOperator[1])();
  }
  uVar2.
  super_unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::LogicalComparisonJoin_*,_std::default_delete<duckdb::LogicalComparisonJoin>_>
  .super__Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false>._M_head_impl =
       delim_join.
       super_unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalComparisonJoin_*,_std::default_delete<duckdb::LogicalComparisonJoin>_>
       .super__Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false>._M_head_impl;
  local_1f0._M_head_impl = (LogicalOperator *)0x0;
  if (local_1c8.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_1c8.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    delim_join.
    super_unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalComparisonJoin_*,_std::default_delete<duckdb::LogicalComparisonJoin>_>
    .super__Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false>._M_head_impl =
         (unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>_>
          )(__uniq_ptr_data<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true,_true>
            )0x0;
    (_Var1._M_head_impl)->_vptr_LogicalOperator =
         (_func_int **)
         uVar2.
         super_unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalComparisonJoin_*,_std::default_delete<duckdb::LogicalComparisonJoin>_>
         .super__Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false>._M_head_impl;
  }
  else {
    if ((char)uVar4 != '\x03') {
      pBVar11 = (BinderException *)__cxa_allocate_exception(0x10);
      local_1a8._0_8_ = local_1a8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,
                 "Join condition for non-inner LATERAL JOIN must be a comparison between the left and right side"
                 ,"");
      BinderException::BinderException(pBVar11,(string *)local_1a8);
      __cxa_throw(pBVar11,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    this_01._M_t.
    super___uniq_ptr_impl<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalFilter_*,_std::default_delete<duckdb::LogicalFilter>_>.
    super__Head_base<0UL,_duckdb::LogicalFilter_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true,_true>
          )operator_new(0x80);
    LogicalFilter::LogicalFilter
              ((LogicalFilter *)
               this_01._M_t.
               super___uniq_ptr_impl<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalFilter_*,_std::default_delete<duckdb::LogicalFilter>_>
               .super__Head_base<0UL,_duckdb::LogicalFilter_*,_false>._M_head_impl);
    filter.super_unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>_>._M_t
    .super___uniq_ptr_impl<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalFilter_*,_std::default_delete<duckdb::LogicalFilter>_>.
    super__Head_base<0UL,_duckdb::LogicalFilter_*,_false>._M_head_impl =
         (unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>_>)
         (unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>_>)
         this_01._M_t.
         super___uniq_ptr_impl<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalFilter_*,_std::default_delete<duckdb::LogicalFilter>_>
         .super__Head_base<0UL,_duckdb::LogicalFilter_*,_false>._M_head_impl;
    pLVar10 = unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>::
              operator->(&filter);
    local_1a8._0_8_ =
         (pLVar10->super_LogicalOperator).expressions.
         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_1a8._8_8_ =
         (pLVar10->super_LogicalOperator).expressions.
         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_1a8._16_8_ =
         (pLVar10->super_LogicalOperator).expressions.
         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (pLVar10->super_LogicalOperator).expressions.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_1c8.
         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (pLVar10->super_LogicalOperator).expressions.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_1c8.
         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (pLVar10->super_LogicalOperator).expressions.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_1c8.
         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1c8.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c8.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)local_1a8);
    pLVar10 = unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>::
              operator->(&filter);
    local_1f8._M_head_impl = (LogicalComparisonJoin *)delim_join;
    delim_join.
    super_unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalComparisonJoin_*,_std::default_delete<duckdb::LogicalComparisonJoin>_>
    .super__Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false>._M_head_impl =
         (unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>_>
          )(__uniq_ptr_data<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true,_true>
            )0x0;
    LogicalOperator::AddChild
              (&pLVar10->super_LogicalOperator,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_1f8);
    if ((_Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false>)local_1f8._M_head_impl !=
        (_Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false>)0x0) {
      (*((local_1f8._M_head_impl)->super_LogicalJoin).super_LogicalOperator._vptr_LogicalOperator[1]
      )();
    }
    tVar3.super_unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalFilter_*,_std::default_delete<duckdb::LogicalFilter>_>.
    super__Head_base<0UL,_duckdb::LogicalFilter_*,_false>._M_head_impl =
         filter.super_unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalFilter_*,_std::default_delete<duckdb::LogicalFilter>_>
         .super__Head_base<0UL,_duckdb::LogicalFilter_*,_false>._M_head_impl;
    local_1f8._M_head_impl = (LogicalComparisonJoin *)0x0;
    filter.super_unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>_>._M_t
    .super___uniq_ptr_impl<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalFilter_*,_std::default_delete<duckdb::LogicalFilter>_>.
    super__Head_base<0UL,_duckdb::LogicalFilter_*,_false>._M_head_impl =
         (unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>_>)
         (__uniq_ptr_data<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true,_true>
          )0x0;
    (_Var1._M_head_impl)->_vptr_LogicalOperator =
         (_func_int **)
         tVar3.super_unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalFilter_*,_std::default_delete<duckdb::LogicalFilter>_>
         .super__Head_base<0UL,_duckdb::LogicalFilter_*,_false>._M_head_impl;
  }
  if ((pointer)local_168.
               super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
               _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.
                    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (dependent_join.
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)dependent_join.
                          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl + 8)
    )();
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&flatten.delim_types.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  ::std::
  _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&flatten.replacement_map._M_h);
  ::std::
  _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&flatten.correlated_map._M_h);
  ::std::
  _Hashtable<std::reference_wrapper<duckdb::LogicalOperator>,_std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::LogicalOperator>,_duckdb::ReferenceHashFunction<duckdb::LogicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&flatten.has_correlated_expressions._M_h);
  if (delim_join.
      super_unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalComparisonJoin_*,_std::default_delete<duckdb::LogicalComparisonJoin>_>
      .super__Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)delim_join.
                          super_unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::LogicalComparisonJoin_*,_std::default_delete<duckdb::LogicalComparisonJoin>_>
                          .super__Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false>.
                          _M_head_impl + 8))();
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)&local_1c8);
  ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::~vector(&local_188);
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         _Var1._M_head_impl;
}

Assistant:

unique_ptr<LogicalOperator> Binder::PlanLateralJoin(unique_ptr<LogicalOperator> left, unique_ptr<LogicalOperator> right,
                                                    vector<CorrelatedColumnInfo> &correlated, JoinType join_type,
                                                    unique_ptr<Expression> condition) {
	// scan the right operator for correlated columns
	// correlated LATERAL JOIN
	vector<JoinCondition> conditions;
	vector<unique_ptr<Expression>> arbitrary_expressions;
	if (condition) {
		if (condition->HasSubquery()) {
			throw BinderException(*condition, "Subqueries are not supported in LATERAL join conditions");
		}
		// extract join conditions, if there are any
		LogicalComparisonJoin::ExtractJoinConditions(context, join_type, JoinRefType::REGULAR, left, right,
		                                             std::move(condition), conditions, arbitrary_expressions);
	}

	auto perform_delim = PerformDuplicateElimination(*this, correlated);
	auto delim_join = CreateDuplicateEliminatedJoin(correlated, join_type, std::move(left), perform_delim);

	FlattenDependentJoins flatten(*this, correlated, perform_delim);

	// first we check which logical operators have correlated expressions in the first place
	flatten.DetectCorrelatedExpressions(*right, true);
	// now we push the dependent join down
	auto dependent_join = flatten.PushDownDependentJoin(std::move(right), join_type != JoinType::INNER);

	// now the dependent join is fully eliminated
	// we only need to create the join conditions between the LHS and the RHS
	// fetch the set of columns
	auto plan_columns = dependent_join->GetColumnBindings();

	// in case of a materialized CTE, the output is defined by the second children operator
	if (dependent_join->type == LogicalOperatorType::LOGICAL_MATERIALIZED_CTE) {
		plan_columns = dependent_join->children[1]->GetColumnBindings();
	}

	// now create the join conditions
	// start off with the conditions that were passed in (if any)
	D_ASSERT(delim_join->conditions.empty());
	delim_join->conditions = std::move(conditions);
	// then add the delim join conditions
	CreateDelimJoinConditions(*delim_join, correlated, plan_columns, flatten.delim_offset, perform_delim);
	delim_join->AddChild(std::move(dependent_join));

	// check if there are any arbitrary expressions left
	if (!arbitrary_expressions.empty()) {
		// we can only evaluate scalar arbitrary expressions for inner joins
		if (join_type != JoinType::INNER) {
			throw BinderException(
			    "Join condition for non-inner LATERAL JOIN must be a comparison between the left and right side");
		}
		auto filter = make_uniq<LogicalFilter>();
		filter->expressions = std::move(arbitrary_expressions);
		filter->AddChild(std::move(delim_join));
		return std::move(filter);
	}
	return std::move(delim_join);
}